

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_replay.cpp
# Opt level: O3

void __thiscall
duckdb::WriteAheadLogDeserializer::ReplayCreateIndex(WriteAheadLogDeserializer *this)

{
  BinaryDeserializer *deserializer;
  ClientContext *context;
  Catalog *this_00;
  optional_ptr<duckdb::TableCatalogEntry,_true> table;
  int iVar1;
  CreateIndexInfo *info;
  pointer pCVar2;
  undefined4 extraout_var;
  DataTableInfo *pDVar3;
  type args_2;
  optional_ptr<duckdb::TableCatalogEntry,_true> entry;
  unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> ptr;
  IndexStorageInfo index_info;
  optional_ptr<duckdb::TableCatalogEntry,_true> local_e0;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_d8;
  _Head_base<0UL,_duckdb::Index_*,_false> local_d0;
  undefined1 local_c8 [96];
  vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_> local_68;
  vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  local_50;
  
  deserializer = &this->deserializer;
  (*(this->deserializer).super_Deserializer._vptr_Deserializer[2])
            (deserializer,0x65,"index_catalog_entry");
  local_d8._M_head_impl = (CreateInfo *)0x0;
  iVar1 = (*(this->deserializer).super_Deserializer._vptr_Deserializer[10])(deserializer);
  if ((char)iVar1 != '\0') {
    (*(deserializer->super_Deserializer)._vptr_Deserializer[6])(deserializer);
    CreateInfo::Deserialize((CreateInfo *)local_c8,&deserializer->super_Deserializer);
    local_d8._M_head_impl = (CreateInfo *)local_c8._0_8_;
    (*(deserializer->super_Deserializer)._vptr_Deserializer[7])(deserializer);
  }
  (*(deserializer->super_Deserializer)._vptr_Deserializer[0xb])(deserializer);
  (*(deserializer->super_Deserializer)._vptr_Deserializer[3])(deserializer);
  (*(deserializer->super_Deserializer)._vptr_Deserializer[2])
            (deserializer,0x66,"index_storage_info");
  (*(deserializer->super_Deserializer)._vptr_Deserializer[6])(deserializer);
  IndexStorageInfo::Deserialize((IndexStorageInfo *)local_c8,&deserializer->super_Deserializer);
  (*(deserializer->super_Deserializer)._vptr_Deserializer[7])(deserializer);
  (*(deserializer->super_Deserializer)._vptr_Deserializer[3])(deserializer);
  ReplayIndexData(this->db,deserializer,(IndexStorageInfo *)local_c8,this->deserialize_only);
  if (this->deserialize_only == false) {
    info = (CreateIndexInfo *)
           unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                       *)&local_d8);
    if ((info->index_type)._M_string_length == 0) {
      ::std::__cxx11::string::_M_replace((ulong)&info->index_type,0,(char *)0x0,0x1385a93);
    }
    context = this->context;
    this_00 = this->catalog;
    pCVar2 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
             operator->((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                         *)&local_d8);
    local_e0 = Catalog::GetEntry<duckdb::TableCatalogEntry>
                         (this_00,context,&pCVar2->schema,&info->table,THROW_EXCEPTION,
                          (QueryErrorContext)0xffffffffffffffff);
    optional_ptr<duckdb::TableCatalogEntry,_true>::CheckValid(&local_e0);
    table.ptr = local_e0.ptr;
    iVar1 = (*((local_e0.ptr)->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
              _vptr_CatalogEntry[0x10])(local_e0.ptr);
    pDVar3 = shared_ptr<duckdb::DataTableInfo,_true>::operator->
                       (&((DataTable *)CONCAT44(extraout_var,iVar1))->info);
    args_2 = shared_ptr<duckdb::TableIOManager,_true>::operator*(&pDVar3->table_io_manager);
    SchemaCatalogEntry::CreateIndex
              (((table.ptr)->super_StandardEntry).schema,this->context,info,table.ptr);
    make_uniq<duckdb::UnboundIndex,duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>,duckdb::IndexStorageInfo,duckdb::TableIOManager&,duckdb::AttachedDatabase&>
              ((duckdb *)&local_e0,
               (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
               &local_d8,(IndexStorageInfo *)local_c8,args_2,this->db);
    local_d0._M_head_impl = (Index *)local_e0.ptr;
    local_e0.ptr = (TableCatalogEntry *)0x0;
    DataTable::AddIndex((DataTable *)CONCAT44(extraout_var,iVar1),
                        (unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *)
                        &local_d0);
    if ((TableCatalogEntry *)local_d0._M_head_impl != (TableCatalogEntry *)0x0) {
      (*(((StandardEntry *)&(local_d0._M_head_impl)->_vptr_Index)->super_InCatalogEntry).
        super_CatalogEntry._vptr_CatalogEntry[1])();
    }
    if (local_e0.ptr != (TableCatalogEntry *)0x0) {
      ::std::default_delete<duckdb::UnboundIndex>::operator()
                ((default_delete<duckdb::UnboundIndex> *)&local_e0,(UnboundIndex *)local_e0.ptr);
    }
  }
  ::std::
  vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  ::~vector(&local_50);
  ::std::vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>::
  ~vector(&local_68);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_c8 + 0x28));
  if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
    operator_delete((void *)local_c8._0_8_);
  }
  if (local_d8._M_head_impl != (CreateInfo *)0x0) {
    (*((local_d8._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  return;
}

Assistant:

void WriteAheadLogDeserializer::ReplayCreateIndex() {
	auto create_info = deserializer.ReadProperty<unique_ptr<CreateInfo>>(101, "index_catalog_entry");
	auto index_info = deserializer.ReadProperty<IndexStorageInfo>(102, "index_storage_info");

	ReplayIndexData(db, deserializer, index_info, DeserializeOnly());
	if (DeserializeOnly()) {
		return;
	}
	auto &info = create_info->Cast<CreateIndexInfo>();

	// Ensure that the index type exists.
	if (info.index_type.empty()) {
		info.index_type = ART::TYPE_NAME;
	}

	auto &table = catalog.GetEntry<TableCatalogEntry>(context, create_info->schema, info.table).Cast<DuckTableEntry>();
	auto &storage = table.GetStorage();
	auto &io_manager = TableIOManager::Get(storage);

	// Create the index in the catalog.
	table.schema.CreateIndex(context, info, table);

	// add the index to the storage
	auto unbound_index = make_uniq<UnboundIndex>(std::move(create_info), std::move(index_info), io_manager, db);
	storage.AddIndex(std::move(unbound_index));
}